

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbglxnativeinterfacehandler.cpp
# Opt level: O2

NativeResourceForContextFunction __thiscall
QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext
          (QXcbGlxNativeInterfaceHandler *this,QByteArray *resource)

{
  bool bVar1;
  int iVar2;
  code *pcVar3;
  NativeResourceForContextFunction p_Var4;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (resourceType(QByteArray_const&)::names == '\0') {
    iVar2 = __cxa_guard_acquire(&resourceType(QByteArray_const&)::names);
    if (iVar2 != 0) {
      local_40.d = (Data *)0x0;
      local_40.ptr = (char *)0x0;
      resourceType(QByteArray_const&)::names._0_8_ = 0;
      resourceType(QByteArray_const&)::names._8_8_ = anon_var_dwarf_4b9a8;
      local_40.size = 0;
      resourceType(QByteArray_const&)::names._16_8_ = 9;
      resourceType(QByteArray_const&)::names._24_8_ = 0;
      local_58.d = (Data *)0x0;
      local_58.ptr = (char *)0x0;
      resourceType(QByteArray_const&)::names._32_8_ = anon_var_dwarf_4b9cb;
      local_58.size = 0;
      resourceType(QByteArray_const&)::names._40_8_ = 10;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&resourceType(QByteArray_const&)::names);
    }
  }
  lVar5 = 0;
  do {
    p_Var4 = (NativeResourceForContextFunction)0x0;
    if (lVar5 == 0x30) {
LAB_0010cc54:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return p_Var4;
      }
      __stack_chk_fail();
    }
    bVar1 = operator==(resource,(QByteArray *)(resourceType(QByteArray_const&)::names + lVar5));
    if (bVar1) {
      pcVar3 = (NativeResourceForContextFunction)0x0;
      if (lVar5 == 0x18) {
        pcVar3 = glxContextForContext;
      }
      p_Var4 = glxConfigForContext;
      if (lVar5 != 0) {
        p_Var4 = pcVar3;
      }
      goto LAB_0010cc54;
    }
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

QPlatformNativeInterface::NativeResourceForContextFunction QXcbGlxNativeInterfaceHandler::nativeResourceFunctionForContext(const QByteArray &resource) const
{
    switch (resourceType(resource)) {
    case GLXConfig:
        return glxConfigForContext;
    case GLXContext:
        return glxContextForContext;
    default:
        break;
    }
    return nullptr;
}